

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O3

int mbedtls_dhm_calc_secret
              (mbedtls_dhm_context *ctx,uchar *output,size_t output_size,size_t *olen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *pmVar1;
  mbedtls_mpi *P;
  mbedtls_mpi *X;
  mbedtls_mpi *pmVar2;
  mbedtls_mpi *X_00;
  int iVar3;
  size_t sVar4;
  int iVar5;
  mbedtls_mpi GYb;
  mbedtls_mpi local_60;
  uchar *local_48;
  size_t *local_40;
  void *local_38;
  
  if (ctx == (mbedtls_dhm_context *)0x0) {
    return -0x3080;
  }
  if (output_size < ctx->len) {
    return -0x3080;
  }
  pmVar1 = &ctx->GY;
  P = &ctx->P;
  local_40 = olen;
  local_38 = p_rng;
  iVar3 = dhm_check_range(pmVar1,P);
  if (iVar3 != 0) {
    return iVar3;
  }
  mbedtls_mpi_init(&local_60);
  if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    iVar3 = mbedtls_mpi_copy(&local_60,pmVar1);
    if (iVar3 != 0) goto LAB_0012ccf1;
    iVar3 = mbedtls_mpi_exp_mod(&ctx->K,&local_60,&ctx->X,P,&ctx->RP);
  }
  else {
    X = &ctx->X;
    local_48 = output;
    iVar3 = mbedtls_mpi_cmp_mpi(X,&ctx->pX);
    if (iVar3 == 0) {
      pmVar2 = &ctx->Vi;
      iVar3 = mbedtls_mpi_cmp_int(pmVar2,1);
      if (iVar3 == 0) {
        iVar5 = 0;
        do {
          sVar4 = mbedtls_mpi_size(P);
          mbedtls_mpi_fill_random(pmVar2,sVar4,f_rng,local_38);
          while (iVar3 = mbedtls_mpi_cmp_mpi(pmVar2,P), -1 < iVar3) {
            iVar3 = mbedtls_mpi_shift_r(pmVar2,1);
            if (iVar3 != 0) goto LAB_0012ccf1;
          }
          if (iVar5 == 0xb) {
            iVar3 = -0xe;
            goto LAB_0012ccf1;
          }
          iVar5 = iVar5 + 1;
          iVar3 = mbedtls_mpi_cmp_int(pmVar2,1);
        } while (iVar3 < 1);
        X_00 = &ctx->Vf;
        iVar3 = mbedtls_mpi_inv_mod(X_00,pmVar2,P);
        if (iVar3 != 0) goto LAB_0012ccf1;
        iVar3 = mbedtls_mpi_exp_mod(X_00,X_00,X,P,&ctx->RP);
      }
      else {
        iVar3 = mbedtls_mpi_mul_mpi(pmVar2,pmVar2,pmVar2);
        if ((iVar3 != 0) || (iVar3 = mbedtls_mpi_mod_mpi(pmVar2,pmVar2,P), iVar3 != 0))
        goto LAB_0012ccf1;
        pmVar2 = &ctx->Vf;
        iVar3 = mbedtls_mpi_mul_mpi(pmVar2,pmVar2,pmVar2);
        if (iVar3 != 0) goto LAB_0012ccf1;
        iVar3 = mbedtls_mpi_mod_mpi(pmVar2,pmVar2,P);
      }
    }
    else {
      iVar3 = mbedtls_mpi_copy(&ctx->pX,X);
      if ((iVar3 != 0) || (iVar3 = mbedtls_mpi_lset(&ctx->Vi,1), iVar3 != 0)) goto LAB_0012ccf1;
      iVar3 = mbedtls_mpi_lset(&ctx->Vf,1);
    }
    if (((iVar3 != 0) || (iVar3 = mbedtls_mpi_mul_mpi(&local_60,pmVar1,&ctx->Vi), iVar3 != 0)) ||
       (iVar3 = mbedtls_mpi_mod_mpi(&local_60,&local_60,P), iVar3 != 0)) goto LAB_0012ccf1;
    pmVar1 = &ctx->K;
    iVar3 = mbedtls_mpi_exp_mod(pmVar1,&local_60,X,P,&ctx->RP);
    if ((iVar3 != 0) || (iVar3 = mbedtls_mpi_mul_mpi(pmVar1,pmVar1,&ctx->Vf), iVar3 != 0))
    goto LAB_0012ccf1;
    iVar3 = mbedtls_mpi_mod_mpi(pmVar1,pmVar1,P);
    output = local_48;
  }
  if (iVar3 == 0) {
    sVar4 = mbedtls_mpi_size(&ctx->K);
    *local_40 = sVar4;
    iVar3 = mbedtls_mpi_write_binary(&ctx->K,output,sVar4);
    mbedtls_mpi_free(&local_60);
    if (iVar3 != 0) {
      return iVar3 + -0x3300;
    }
    return 0;
  }
LAB_0012ccf1:
  mbedtls_mpi_free(&local_60);
  return iVar3 + -0x3300;
}

Assistant:

int mbedtls_dhm_calc_secret( mbedtls_dhm_context *ctx,
                     unsigned char *output, size_t output_size, size_t *olen,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret;
    mbedtls_mpi GYb;

    if( ctx == NULL || output_size < ctx->len )
        return( MBEDTLS_ERR_DHM_BAD_INPUT_DATA );

    if( ( ret = dhm_check_range( &ctx->GY, &ctx->P ) ) != 0 )
        return( ret );

    mbedtls_mpi_init( &GYb );

    /* Blind peer's value */
    if( f_rng != NULL )
    {
        MBEDTLS_MPI_CHK( dhm_update_blinding( ctx, f_rng, p_rng ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &GYb, &ctx->GY, &ctx->Vi ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &GYb, &GYb, &ctx->P ) );
    }
    else
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &GYb, &ctx->GY ) );

    /* Do modular exponentiation */
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &ctx->K, &GYb, &ctx->X,
                          &ctx->P, &ctx->RP ) );

    /* Unblind secret value */
    if( f_rng != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ctx->K, &ctx->K, &ctx->Vf ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &ctx->K, &ctx->K, &ctx->P ) );
    }

    *olen = mbedtls_mpi_size( &ctx->K );

    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &ctx->K, output, *olen ) );

cleanup:
    mbedtls_mpi_free( &GYb );

    if( ret != 0 )
        return( MBEDTLS_ERR_DHM_CALC_SECRET_FAILED + ret );

    return( 0 );
}